

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

void ws_listener_close(void *arg)

{
  undefined8 local_20;
  nni_ws *ws;
  nni_ws_listener *l;
  void *arg_local;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 0x60));
  if ((*(byte *)((long)arg + 0x111) & 1) == 0) {
    *(undefined1 *)((long)arg + 0x111) = 1;
    if ((*(byte *)((long)arg + 0x110) & 1) != 0) {
      nni_http_server_del_handler
                (*(nni_http_server **)((long)arg + 0x50),*(nni_http_handler **)((long)arg + 0x118));
      nni_http_server_close(*(nni_http_server **)((long)arg + 0x50));
      *(undefined1 *)((long)arg + 0x110) = 0;
    }
    for (local_20 = (nni_ws *)nni_list_first((nni_list *)((long)arg + 0xc0));
        local_20 != (nni_ws *)0x0;
        local_20 = (nni_ws *)nni_list_next((nni_list *)((long)arg + 0xc0),local_20)) {
      ws_close_error(local_20,0x3e9);
    }
    for (local_20 = (nni_ws *)nni_list_first((nni_list *)((long)arg + 0xd8));
        local_20 != (nni_ws *)0x0;
        local_20 = (nni_ws *)nni_list_next((nni_list *)((long)arg + 0xd8),local_20)) {
      ws_close_error(local_20,0x3e9);
    }
    nni_mtx_unlock((nni_mtx *)((long)arg + 0x60));
  }
  else {
    nni_mtx_unlock((nni_mtx *)((long)arg + 0x60));
  }
  return;
}

Assistant:

static void
ws_listener_close(void *arg)
{
	nni_ws_listener *l = arg;
	nni_ws          *ws;
	nni_mtx_lock(&l->mtx);
	if (l->closed) {
		nni_mtx_unlock(&l->mtx);
		return;
	}
	l->closed = true;
	if (l->started) {
		nni_http_server_del_handler(l->server, l->handler);
		nni_http_server_close(l->server);
		l->started = false;
	}
	NNI_LIST_FOREACH (&l->pend, ws) {
		ws_close_error(ws, WS_CLOSE_GOING_AWAY);
	}
	NNI_LIST_FOREACH (&l->reply, ws) {
		ws_close_error(ws, WS_CLOSE_GOING_AWAY);
	}
	nni_mtx_unlock(&l->mtx);
}